

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

void __thiscall Js::DynamicObject::SetObjectArray(DynamicObject *this,ArrayObject *objArray)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  bVar2 = IsAnyArray(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0xbf,"(!IsAnyArray(this))","!IsAnyArray(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  DeoptimizeObjectHeaderInlining(this);
  Memory::Recycler::WBSetBit((char *)&this->field_1);
  this->field_1 = (anon_union_8_2_815e7e51_for_DynamicObject_2)objArray;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_1);
  if (objArray != (ArrayObject *)0x0) {
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(this);
    if (iVar3 == 0) {
      (*(objArray->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x35])(objArray);
    }
    if ((*(byte *)(*(long *)((this->super_RecyclableObject).type.ptr + 1) + 9) & 0x20) != 0) {
      (*(objArray->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[100])(objArray);
      return;
    }
  }
  return;
}

Assistant:

void DynamicObject::SetObjectArray(ArrayObject* objArray)
    {
        Assert(!IsAnyArray(this));

        DeoptimizeObjectHeaderInlining();

        this->objectArray = objArray;
        if (objArray)
        {
            if (!this->IsExtensible()) // sync objectArray isExtensible
            {
                objArray->PreventExtensions();
            }

            // sync objectArray is prototype
            if ((this->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0)
            {
                objArray->SetIsPrototype();
            }
        }
    }